

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::~BaseTag(BaseTag *this)

{
  code *pcVar1;
  BaseTag *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BaseTag::~BaseTag() {
}